

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::dp_SetDiscountParam::operator()
          (dp_SetDiscountParam *this,iterator_t *first,iterator_t *last)

{
  parsed_t pVar1;
  ParserDPOMDPFormat_Spirit *pPVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  string s;
  allocator<char> local_101;
  long *local_100 [2];
  long local_f0 [2];
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_e0;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_78;
  
  auVar4 = in_ZMM0._0_16_;
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_78,first);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_e0,last);
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            ((string *)local_100,&local_78,&local_e0,&local_101);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_e0._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_e0._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_e0._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_e0._end.super_type.m_iterator.m_mem.pn);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_e0.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_78._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_78._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_78._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_78._end.super_type.m_iterator.m_mem.pn);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_78.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  pPVar2 = this->_m_po;
  pVar1 = pPVar2->_m_lp_type;
  if (pVar1 == INT) {
    dVar3 = (double)pPVar2->_m_lp_int;
  }
  else if (pVar1 == UINT) {
    auVar4 = vcvtusi2sd_avx512f(auVar4,pPVar2->_m_lp_uint);
    dVar3 = auVar4._0_8_;
  }
  else if (pVar1 == DOUBLE) {
    dVar3 = pPVar2->_m_lp_double;
  }
  else {
    dVar3 = -1.0;
  }
  (**(code **)(*(long *)&(pPVar2->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete).
                         field_0x200 + 0x68))
            (dVar3,&(pPVar2->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete).
                    field_0x200);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  return;
}

Assistant:

void operator()(iterator_t first, iterator_t last) const
            {
                std::string  s(first, last);
                if(DEBUG_PARSE){std::cout << "discount="<<s << std::endl;}
                double discount = -1.0;
                if( _m_po->_m_lp_type == DOUBLE )
                {
                    if(DEBUG_PARSE){std::cout <<"last parsed number was a DOUBLE"<<
                        "(_m_po->_m_lp_double = "<<_m_po->_m_lp_double<<")\n";}
                    discount = _m_po->_m_lp_double;
                }
                else if (_m_po->_m_lp_type == INT)
                { 
                    if(DEBUG_PARSE){std::cout <<"last parsed number was a INT"<<
                        "(_m_po->_m_lp_int = "<<_m_po->_m_lp_int<<")\n";}
                    //the discount was parsed as an int
                    discount = (double) _m_po->_m_lp_int;
                }                
                else if (_m_po->_m_lp_type == UINT)
                { 
                    if(DEBUG_PARSE){std::cout <<"last parsed number was a UINT"<<
                        "(_m_po->_m_lp_uint = "<<_m_po->_m_lp_uint<<")\n";}
                    //the discount was parsed as an int
                    discount = (double) _m_po->_m_lp_uint;
                }
                
                if(DEBUG_PARSE){std::cout <<"dp_SetDiscountParam - discount="<<
                    discount<<std::endl;} 
                _m_po->GetDecPOMDPDiscrete()->SetDiscount(discount);
            }